

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

boolean propagate(int mndx,boolean tally,boolean ghostly)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  
  bVar5 = 0x78;
  if (mndx == 0x131) {
    bVar5 = 3;
  }
  bVar3 = 9;
  if (mndx != 0xed) {
    bVar3 = bVar5;
  }
  bVar5 = mvitals[mndx].born;
  bVar2 = bVar5 < bVar3;
  bVar4 = mvitals[mndx].mvflags;
  bVar6 = (bVar4 & 3) == 0;
  uVar1 = mons[mndx].geno;
  if ((uVar1 >> 0xc & 1) != 0) {
    bVar4 = bVar4 | 1;
    mvitals[mndx].mvflags = bVar4;
  }
  if (((tally != '\0') && (bVar5 != 0xff)) && (ghostly == '\0' || bVar2 && bVar6)) {
    bVar5 = bVar5 + 1;
    mvitals[mndx].born = bVar5;
  }
  if ((((uVar1 >> 9 & 1) == 0) && (bVar3 <= bVar5)) && ((bVar4 & 1) == 0)) {
    mvitals[mndx].mvflags = bVar4 | 1;
    if (mndx == -1) {
      rndmonst_state.choice_count = -1;
    }
    else if (mndx < 0x158) {
      rndmonst_state.choice_count = rndmonst_state.choice_count - rndmonst_state.mchoices[mndx];
      rndmonst_state.mchoices[mndx] = '\0';
    }
  }
  return bVar2 && bVar6;
}

Assistant:

boolean propagate(int mndx, boolean tally, boolean ghostly)
{
	boolean result;
	uchar lim = mbirth_limit(mndx);
	boolean gone = (mvitals[mndx].mvflags & G_GONE); /* genocided or extinct */

	result = (((int) mvitals[mndx].born < lim) && !gone) ? TRUE : FALSE;

	/* if it's unique, don't ever make it again */
	if (mons[mndx].geno & G_UNIQ) mvitals[mndx].mvflags |= G_EXTINCT;

	if (mvitals[mndx].born < 255 && tally && (!ghostly || (ghostly && result)))
		 mvitals[mndx].born++;
	if ((int) mvitals[mndx].born >= lim && !(mons[mndx].geno & G_NOGEN) &&
		!(mvitals[mndx].mvflags & G_EXTINCT)) {
		mvitals[mndx].mvflags |= G_EXTINCT;
		reset_rndmonst(mndx);
	}
	return result;
}